

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# server.c
# Opt level: O3

size_t nh_base64_encode(uchar *src,size_t src_len,uchar *dest)

{
  byte *pbVar1;
  uchar *puVar2;
  uchar uVar3;
  uint uVar4;
  
  if ((src_len * 4) / 3 + 5 < src_len) {
    return 0;
  }
  pbVar1 = src + src_len;
  puVar2 = dest;
  if (2 < src_len) {
    do {
      *puVar2 = "ABCDEFGHIJKLMNOPQRSTUVWXYZabcdefghijklmnopqrstuvwxyz0123456789+/"[*src >> 2];
      puVar2[1] = "ABCDEFGHIJKLMNOPQRSTUVWXYZabcdefghijklmnopqrstuvwxyz0123456789+/"
                  [(uint)(src[1] >> 4) | (*src & 3) << 4];
      puVar2[2] = "ABCDEFGHIJKLMNOPQRSTUVWXYZabcdefghijklmnopqrstuvwxyz0123456789+/"
                  [(uint)(src[2] >> 6) + (src[1] & 0xf) * 4];
      puVar2[3] = "ABCDEFGHIJKLMNOPQRSTUVWXYZabcdefghijklmnopqrstuvwxyz0123456789+/"[src[2] & 0x3f];
      puVar2 = puVar2 + 4;
      src = src + 3;
      src_len = src_len - 3;
    } while (2 < (long)src_len);
  }
  if (pbVar1 != src) {
    *puVar2 = "ABCDEFGHIJKLMNOPQRSTUVWXYZabcdefghijklmnopqrstuvwxyz0123456789+/"[*src >> 2];
    uVar4 = (*src & 3) << 4;
    if (src_len == 1) {
      puVar2[1] = "ABCDEFGHIJKLMNOPQRSTUVWXYZabcdefghijklmnopqrstuvwxyz0123456789+/"[uVar4];
      uVar3 = '=';
    }
    else {
      puVar2[1] = "ABCDEFGHIJKLMNOPQRSTUVWXYZabcdefghijklmnopqrstuvwxyz0123456789+/"
                  [(byte)((byte)uVar4 | src[1] >> 4)];
      uVar3 = "ABCDEFGHIJKLMNOPQRSTUVWXYZabcdefghijklmnopqrstuvwxyz0123456789+/"
              [(ulong)(src[1] & 0xf) * 4];
    }
    puVar2[2] = uVar3;
    puVar2[3] = '=';
    puVar2 = puVar2 + 4;
  }
  *puVar2 = '\0';
  return (long)puVar2 - (long)dest;
}

Assistant:

size_t nh_base64_encode(const unsigned char *src, size_t src_len, unsigned char *dest) {
    // modified from http://web.mit.edu/freebsd/head/contrib/wpa/src/utils/base64.c
    size_t olen = src_len * 4 / 3 + 4; /* 3-byte blocks to 4-byte */
    olen++; /* nul termination */
    if (olen < src_len) return 0;

    unsigned char const *end = src + src_len;
    unsigned char const *in = src;
    unsigned char *pos = dest;
    while (end - in >= 3) {
        *pos++ = nh_base64_table[in[0] >> 2];
        *pos++ = nh_base64_table[((in[0] & 0x03) << 4) | (in[1] >> 4)];
        *pos++ = nh_base64_table[((in[1] & 0x0f) << 2) | (in[2] >> 6)];
        *pos++ = nh_base64_table[in[2] & 0x3f];
        in += 3;
    }

    if (end - in) {
        *pos++ = nh_base64_table[in[0] >> 2];
        if (end - in == 1) {
            *pos++ = nh_base64_table[(in[0] & 0x03) << 4];
            *pos++ = '=';
        } else {
            *pos++ = nh_base64_table[((in[0] & 0x03) << 4) | (in[1] >> 4)];
            *pos++ = nh_base64_table[(in[1] & 0x0f) << 2];
        }
        *pos++ = '=';
    }

    *pos = '\0';
    return pos - dest;
}